

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O1

CESkyCoord * __thiscall
CESkyCoord::ConvertToCIRS
          (CESkyCoord *__return_storage_ptr__,CESkyCoord *this,CEDate *date,CEObserver *observer)

{
  CESkyCoord(__return_storage_ptr__);
  switch(this->coord_type_) {
  case CIRS:
    SetCoordinates(__return_storage_ptr__,this);
    break;
  case ICRS:
    ICRS2CIRS(this,__return_storage_ptr__,date);
    break;
  case GALACTIC:
    Galactic2CIRS(this,__return_storage_ptr__,date);
    break;
  case OBSERVED:
    Observed2CIRS(this,__return_storage_ptr__,date,observer);
    break;
  case ECLIPTIC:
    Ecliptic2CIRS(this,__return_storage_ptr__,date);
  }
  return __return_storage_ptr__;
}

Assistant:

CESkyCoord CESkyCoord::ConvertToCIRS(const CEDate&     date,
                                     const CEObserver& observer)
{
    // Create the coordinate to be returned
    CESkyCoord cirs;

    // Convert
    if (coord_type_ == CESkyCoordType::CIRS) {
        // CIRS -> CIRS
        cirs.SetCoordinates(*this);
    } else if (coord_type_ == CESkyCoordType::ICRS) {
        // ICRS -> CIRS
        ICRS2CIRS(*this, &cirs, date);
    } else if (coord_type_ == CESkyCoordType::GALACTIC) {
        // Galactic -> CIRS
        Galactic2CIRS(*this, &cirs, date);
    } else if (coord_type_ == CESkyCoordType::OBSERVED) {
        // Observed -> CIRS
        Observed2CIRS(*this, &cirs, date, observer);
    } else if (coord_type_ == CESkyCoordType::ECLIPTIC) {
        // ECLIPTIC -> CIRS
        Ecliptic2CIRS(*this, &cirs, date);
    }
    
    return cirs;
}